

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::SetupInitial(ChElementBeamANCF_3243 *this,ChSystem *system)

{
  CalcCoordMatrix(this,&this->m_ebar0);
  ComputeMassMatrixAndGravityForce(this);
  PrecomputeInternalForceMatricesWeights(this);
  return;
}

Assistant:

void ChElementBeamANCF_3243::SetupInitial(ChSystem* system) {
    // Store the initial nodal coordinates. These values define the reference configuration of the element.
    CalcCoordMatrix(m_ebar0);

    // Compute and store the constant mass matrix and the matrix used to multiply the acceleration due to gravity to get
    // the generalized gravitational force vector for the element
    ComputeMassMatrixAndGravityForce();

    // Compute any required matrices and vectors for the generalized internal force and Jacobian calculations
    PrecomputeInternalForceMatricesWeights();
}